

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenEmbeddedIncludes(CppGenerator *this)

{
  Parser *pPVar1;
  CodeWriter *this_00;
  string file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->opts).binary_schema_gen_embed == true) &&
     (pPVar1->root_struct_def_ != (StructDef *)0x0)) {
    std::operator+(&local_c0,(this->super_BaseGenerator).file_name_,"_bfbs");
    BaseGenerator::GeneratedFileName
              (&local_40,&this->super_BaseGenerator,&(this->opts_).super_IDLOptions.include_prefix,
               &local_c0,&(this->opts_).super_IDLOptions);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"// For access to the binary schema that produced this file.",
               (allocator<char> *)&local_c0);
    this_00 = &this->code_;
    CodeWriter::operator+=(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::operator+(&local_c0,"#include \"",&local_40);
    std::operator+(&local_80,&local_c0,"\"");
    CodeWriter::operator+=(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"",(allocator<char> *)&local_c0);
    CodeWriter::operator+=(this_00,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void GenEmbeddedIncludes() {
    if (parser_.opts.binary_schema_gen_embed && parser_.root_struct_def_) {
      const std::string file_path =
          GeneratedFileName(opts_.include_prefix, file_name_ + "_bfbs", opts_);
      code_ += "// For access to the binary schema that produced this file.";
      code_ += "#include \"" + file_path + "\"";
      code_ += "";
    }
  }